

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  ImGuiContext *pIVar1;
  char *pcVar2;
  char *pcVar3;
  size_t in_RSI;
  char *in_RDI;
  char *name_start;
  char *type_end;
  char *type_start;
  char *name_end;
  char *line;
  char *line_end;
  ImGuiSettingsHandler *entry_handler;
  void *entry_data;
  char *buf_end;
  char *buf;
  ImGuiContext *g;
  void *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  uint6 in_stack_ffffffffffffff90;
  undefined1 uVar4;
  undefined1 uVar5;
  char *local_68;
  char *local_48;
  char *local_40;
  ImGuiSettingsHandler *local_38;
  void *local_30;
  size_t local_10;
  
  pIVar1 = GImGui;
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = strlen(in_RDI);
  }
  local_48 = (char *)MemAlloc((size_t)in_stack_ffffffffffffff80);
  pcVar2 = local_48 + local_10;
  memcpy(local_48,in_RDI,local_10);
  local_48[local_10] = '\0';
  local_30 = (void *)0x0;
  local_38 = (ImGuiSettingsHandler *)0x0;
  while (local_48 < pcVar2) {
    while( true ) {
      uVar5 = true;
      if (*local_48 != '\n') {
        uVar5 = *local_48 == '\r';
      }
      if ((bool)uVar5 == false) break;
      local_48 = local_48 + 1;
    }
    local_40 = local_48;
    while( true ) {
      uVar4 = false;
      if ((local_40 < pcVar2) && (uVar4 = false, *local_40 != '\n')) {
        uVar4 = *local_40 != '\r';
      }
      if ((bool)uVar4 == false) break;
      local_40 = local_40 + 1;
    }
    *local_40 = '\0';
    if (*local_48 != ';') {
      if (((*local_48 == '[') && (local_48 < local_40)) && (local_40[-1] == ']')) {
        local_40[-1] = '\0';
        pcVar3 = ImStrchrRange((char *)(ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                               (char)((ulong)in_stack_ffffffffffffff80 >> 0x38));
        if (pcVar3 == (char *)0x0) {
          in_stack_ffffffffffffff88 = (char *)0x0;
        }
        else {
          in_stack_ffffffffffffff88 =
               ImStrchrRange((char *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff90)),
                             in_stack_ffffffffffffff88,
                             (char)((ulong)in_stack_ffffffffffffff80 >> 0x38));
          if (in_stack_ffffffffffffff88 != (char *)0x0) {
            *pcVar3 = '\0';
            local_48 = in_stack_ffffffffffffff88;
          }
        }
        local_68 = local_48 + 1;
        local_38 = FindSettingsHandler(in_stack_ffffffffffffff88);
        if (local_38 == (ImGuiSettingsHandler *)0x0) {
          in_stack_ffffffffffffff80 = (void *)0x0;
          local_30 = in_stack_ffffffffffffff80;
        }
        else {
          in_stack_ffffffffffffff80 = (*local_38->ReadOpenFn)(pIVar1,local_38,local_68);
          local_30 = in_stack_ffffffffffffff80;
        }
      }
      else if ((local_38 != (ImGuiSettingsHandler *)0x0) && (local_30 != (void *)0x0)) {
        (*local_38->ReadLineFn)(pIVar1,local_38,local_30,local_48);
      }
    }
    local_48 = local_40 + 1;
  }
  MemFree(in_stack_ffffffffffffff80);
  pIVar1->SettingsLoaded = true;
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    char* buf = (char*)ImGui::MemAlloc(ini_size + 1);
    char* buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf[ini_size] = 0;

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(intptr_t)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
            {
                name_start = type_start; // Import legacy entries that have no type
                type_start = "Window";
            }
            else
            {
                *type_end = 0; // Overwrite first ']'
                name_start++;  // Skip second '['
            }
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    ImGui::MemFree(buf);
    g.SettingsLoaded = true;
}